

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

_Bool DockNodeIsDropAllowedOne(ImGuiWindow_conflict *payload,ImGuiWindow_conflict *host_window)

{
  _Bool _Var1;
  ImGuiWindowClass *pIVar2;
  ImGuiWindowClass *local_38;
  ImGuiWindowClass *payload_class;
  ImGuiWindowClass *host_class;
  ImGuiWindow_conflict *host_window_local;
  ImGuiWindow_conflict *payload_local;
  
  if (((host_window->DockNodeAsHost == (ImGuiDockNode *)0x0) ||
      (_Var1 = ImGuiDockNode::IsDockSpace(host_window->DockNodeAsHost), !_Var1)) ||
     (host_window->BeginOrderWithinContext <= payload->BeginOrderWithinContext)) {
    if (host_window->DockNodeAsHost == (ImGuiDockNode *)0x0) {
      local_38 = &host_window->WindowClass;
    }
    else {
      local_38 = &host_window->DockNodeAsHost->WindowClass;
    }
    pIVar2 = &payload->WindowClass;
    if (local_38->ClassId == pIVar2->ClassId) {
      payload_local._7_1_ = true;
    }
    else if (((local_38->ClassId == 0) || ((local_38->DockingAllowUnclassed & 1U) == 0)) ||
            (pIVar2->ClassId != 0)) {
      if (((pIVar2->ClassId == 0) || (((payload->WindowClass).DockingAllowUnclassed & 1U) == 0)) ||
         (local_38->ClassId != 0)) {
        payload_local._7_1_ = false;
      }
      else {
        payload_local._7_1_ = true;
      }
    }
    else {
      payload_local._7_1_ = true;
    }
  }
  else {
    payload_local._7_1_ = false;
  }
  return payload_local._7_1_;
}

Assistant:

static bool DockNodeIsDropAllowedOne(ImGuiWindow* payload, ImGuiWindow* host_window)
{
    if (host_window->DockNodeAsHost && host_window->DockNodeAsHost->IsDockSpace() && payload->BeginOrderWithinContext < host_window->BeginOrderWithinContext)
        return false;

    ImGuiWindowClass* host_class = host_window->DockNodeAsHost ? &host_window->DockNodeAsHost->WindowClass : &host_window->WindowClass;
    ImGuiWindowClass* payload_class = &payload->WindowClass;
    if (host_class->ClassId != payload_class->ClassId)
    {
        if (host_class->ClassId != 0 && host_class->DockingAllowUnclassed && payload_class->ClassId == 0)
            return true;
        if (payload_class->ClassId != 0 && payload_class->DockingAllowUnclassed && host_class->ClassId == 0)
            return true;
        return false;
    }

    return true;
}